

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogFinish(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiTextBuffer *this;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->LogEnabled & 1U) != 0) {
    LogText("\n");
    this = (ImGuiTextBuffer *)(ulong)pIVar1->LogType;
    switch(this) {
    case (ImGuiTextBuffer *)0x0:
      break;
    case (ImGuiTextBuffer *)0x1:
      fflush((FILE *)pIVar1->LogFile);
      break;
    case (ImGuiTextBuffer *)0x2:
      ImFileClose((ImFileHandle)0x140483);
      break;
    case (ImGuiTextBuffer *)0x3:
      break;
    case (ImGuiTextBuffer *)0x4:
      bVar2 = ImGuiTextBuffer::empty(&pIVar1->LogBuffer);
      if (!bVar2) {
        ImGuiTextBuffer::begin(this);
        SetClipboardText((char *)this);
      }
    }
    pIVar1->LogEnabled = false;
    pIVar1->LogType = ImGuiLogType_None;
    pIVar1->LogFile = (ImFileHandle)0x0;
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1404f5);
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    switch (g.LogType)
    {
    case ImGuiLogType_TTY:
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        fflush(g.LogFile);
#endif
        break;
    case ImGuiLogType_File:
        ImFileClose(g.LogFile);
        break;
    case ImGuiLogType_Buffer:
        break;
    case ImGuiLogType_Clipboard:
        if (!g.LogBuffer.empty())
            SetClipboardText(g.LogBuffer.begin());
        break;
    case ImGuiLogType_None:
        IM_ASSERT(0);
        break;
    }

    g.LogEnabled = false;
    g.LogType = ImGuiLogType_None;
    g.LogFile = NULL;
    g.LogBuffer.clear();
}